

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O1

void __thiscall
autoSimplification_associative5_Test::~autoSimplification_associative5_Test
          (autoSimplification_associative5_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(autoSimplification, associative5)
{
    auto const n2 = 2_i;
    auto const n3 = 3_i;
    auto const n4 = 4_i;
    auto const x = symbol("x");
    auto const y = symbol("y");
    auto const z = symbol("z");
    auto const e = n2 * (x * y * z) + n3 * x * (y * z) + n4 * (x * y) * z;
    EXPECT_EQ(toString(e), "(* 9 x y z)");
}